

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O1

void tok_str_add2(TokenString *s,int t,CValue *cv)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar2 = s->len;
  s->lastlen = iVar2;
  if (iVar2 + 4 < s->allocated_len) {
    piVar3 = s->str;
  }
  else {
    piVar3 = tok_str_realloc(s,iVar2 + 5);
  }
  uVar4 = iVar2 + 1;
  uVar5 = (ulong)uVar4;
  piVar3[iVar2] = t;
  switch(t) {
  case 0xb3:
  case 0xb4:
  case 0xb5:
  case 0xb6:
  case 0xbb:
  case 0xc0:
    uVar5 = (ulong)(iVar2 + 2);
    piVar3[(long)iVar2 + 1] = (int)cv->f;
    break;
  case 0xb7:
  case 0xb8:
  case 0xbc:
  case 0xce:
  case 0xcf:
    piVar3[(int)uVar4] = (int)cv->f;
    uVar5 = (ulong)(iVar2 + 3);
    piVar3[(long)iVar2 + 2] = cv->tab[1];
    break;
  case 0xb9:
  case 0xba:
  case 0xbe:
  case 0xbf:
    lVar1 = (long)(int)uVar4 + ((long)(cv->str).size + 3U >> 2);
    uVar5 = lVar1 + 1;
    if ((ulong)(long)s->allocated_len <= uVar5) {
      piVar3 = tok_str_realloc(s,(int)lVar1 + 2);
    }
    piVar3[(int)uVar4] = (int)cv->f;
    memcpy(piVar3 + (long)iVar2 + 2,(cv->str).data,(long)(cv->str).size);
    break;
  case 0xbd:
    piVar3[(int)uVar4] = (int)cv->f;
    piVar3[(long)iVar2 + 2] = cv->tab[1];
    piVar3[(long)iVar2 + 3] = cv->tab[2];
    uVar5 = (ulong)(iVar2 + 5);
    piVar3[(long)iVar2 + 4] = cv->tab[3];
  }
  s->len = (int)uVar5;
  return;
}

Assistant:

static void tok_str_add2(TokenString* s, int t, CValue* cv) {
  int len, *str;

  len = s->lastlen = s->len;
  str = s->str;

  /* allocate space for worst case */
  if (len + TOK_MAX_SIZE >= s->allocated_len)
    str = tok_str_realloc(s, len + TOK_MAX_SIZE + 1);
  str[len++] = t;
  switch (t) {
    case TOK_CINT:
    case TOK_CUINT:
    case TOK_CCHAR:
    case TOK_LCHAR:
    case TOK_CFLOAT:
    case TOK_LINENUM:
#if LONG_SIZE == 4
    case TOK_CLONG:
    case TOK_CULONG:
#endif
      str[len++] = cv->tab[0];
      break;
    case TOK_PPNUM:
    case TOK_PPSTR:
    case TOK_STR:
    case TOK_LSTR: {
      /* Insert the string into the int array. */
      size_t nb_words = 1 + (cv->str.size + sizeof(int) - 1) / sizeof(int);
      if (len + nb_words >= s->allocated_len)
        str = tok_str_realloc(s, len + nb_words + 1);
      str[len] = cv->str.size;
      memcpy(&str[len + 1], cv->str.data, cv->str.size);
      len += nb_words;
    } break;
    case TOK_CDOUBLE:
    case TOK_CLLONG:
    case TOK_CULLONG:
#if LONG_SIZE == 8
    case TOK_CLONG:
    case TOK_CULONG:
#endif
#if LDOUBLE_SIZE == 8
    case TOK_CLDOUBLE:
#endif
      str[len++] = cv->tab[0];
      str[len++] = cv->tab[1];
      break;
#if LDOUBLE_SIZE == 12
    case TOK_CLDOUBLE:
      str[len++] = cv->tab[0];
      str[len++] = cv->tab[1];
      str[len++] = cv->tab[2];
#elif LDOUBLE_SIZE == 16
    case TOK_CLDOUBLE:
      str[len++] = cv->tab[0];
      str[len++] = cv->tab[1];
      str[len++] = cv->tab[2];
      str[len++] = cv->tab[3];
#elif LDOUBLE_SIZE != 8
#error add long double size support
#endif
      break;
    default:
      break;
  }
  s->len = len;
}